

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeSIMD(TranslateToFuzzReader *this,Type type)

{
  uint32_t uVar1;
  Expression *pEVar2;
  
  if (((this->wasm->features).features & 8) == 0) {
    __assert_fail("wasm.features.hasSIMD()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1178,"Expression *wasm::TranslateToFuzzReader::makeSIMD(Type)");
  }
  if ((type.id & 1) != 0 || type.id < 7) {
    if (type.id == 6) {
      uVar1 = Random::upTo(&this->random,7);
      switch(uVar1) {
      case 0:
        pEVar2 = makeUnary(this,(Type)0x6);
        return pEVar2;
      case 1:
        pEVar2 = makeBinary(this,(Type)0x6);
        return pEVar2;
      case 2:
        pEVar2 = makeSIMDReplace(this);
        return pEVar2;
      case 3:
        pEVar2 = makeSIMDShuffle(this);
        return pEVar2;
      case 4:
        pEVar2 = makeSIMDTernary(this);
        return pEVar2;
      case 5:
        pEVar2 = makeSIMDShift(this);
        return pEVar2;
      case 6:
        pEVar2 = makeSIMDLoad(this);
        return pEVar2;
      default:
        wasm::handle_unreachable
                  ("invalid value",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0x1190);
      }
    }
    pEVar2 = makeSIMDExtract(this,type);
    return pEVar2;
  }
  pEVar2 = makeTrivial(this,type);
  return pEVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeSIMD(Type type) {
  assert(wasm.features.hasSIMD());
  if (type.isRef()) {
    return makeTrivial(type);
  }
  if (type != Type::v128) {
    return makeSIMDExtract(type);
  }
  // TODO: Add SIMDLoadStoreLane once it is generally available
  switch (upTo(7)) {
    case 0:
      return makeUnary(Type::v128);
    case 1:
      return makeBinary(Type::v128);
    case 2:
      return makeSIMDReplace();
    case 3:
      return makeSIMDShuffle();
    case 4:
      return makeSIMDTernary();
    case 5:
      return makeSIMDShift();
    case 6:
      return makeSIMDLoad();
  }
  WASM_UNREACHABLE("invalid value");
}